

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O2

int __thiscall
cmCPackIFWPackage::ConfigureFromGroup(cmCPackIFWPackage *this,cmCPackComponentGroup *group)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmCPackIFWGenerator *pcVar1;
  cmCPackLog *pcVar2;
  int iVar3;
  mapped_type *pmVar4;
  cmValue cVar5;
  ostream *poVar6;
  string local_1d8;
  string prefix;
  ostringstream cmCPackLog_msg;
  
  if (group == (cmCPackComponentGroup *)0x0) {
    iVar3 = 0;
  }
  else {
    DefaultConfiguration(this);
    cmsys::SystemTools::UpperCase(&local_1d8,&group->Name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,"CPACK_IFW_COMPONENT_GROUP_",&local_1d8);
    std::operator+(&prefix,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &cmCPackLog_msg,"_");
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"",(allocator<char> *)&local_1d8);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->DisplayName,(key_type *)&cmCPackLog_msg);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"",(allocator<char> *)&local_1d8);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->Description,(key_type *)&cmCPackLog_msg);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,&prefix,"VERSION");
    cVar5 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (cVar5.Value == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_VERSION",(allocator<char> *)&local_1d8);
      cVar5 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      if (cVar5.Value == (string *)0x0) {
        std::__cxx11::string::assign((char *)&this->Version);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&this->Version);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&this->Version);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,&prefix,"SCRIPT");
    cVar5 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (cVar5.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->Script);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,&prefix,"USER_INTERFACES");
    cVar5 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (cVar5.Value != (string *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->UserInterfaces);
      cmList::append(&this->UserInterfaces,cVar5,No);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,&prefix,"LICENSES");
    cVar5 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (cVar5.Value != (string *)0x0) {
      this_00 = &this->Licenses;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(this_00);
      cmList::append(this_00,cVar5,No);
      if ((*(int *)&(this->Licenses).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
           *(int *)&(this->Licenses).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start & 0x20U) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar6 = std::operator<<((ostream *)&cmCPackLog_msg,(string *)&prefix);
        poVar6 = std::operator<<(poVar6,"LICENSES");
        poVar6 = std::operator<<(poVar6," should contain pairs of <display_name> and <file_path>.");
        std::endl<char,std::char_traits<char>>(poVar6);
        pcVar1 = (this->super_cmCPackIFWCommon).Generator;
        if (pcVar1 != (cmCPackIFWGenerator *)0x0) {
          pcVar2 = (pcVar1->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar2,8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                          ,0x142,local_1d8._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_1d8);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(this_00);
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,&prefix,"PRIORITY");
    cVar5 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (cVar5.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->SortingPriority);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar6 = std::operator<<((ostream *)&cmCPackLog_msg,"The \"PRIORITY\" option is set ");
      poVar6 = std::operator<<(poVar6,"for component group \"");
      poVar6 = std::operator<<(poVar6,(string *)group);
      poVar6 = std::operator<<(poVar6,"\", but there option is ");
      poVar6 = std::operator<<(poVar6,"deprecated. Please use \"SORTING_PRIORITY\" option instead.")
      ;
      std::endl<char,std::char_traits<char>>(poVar6);
      pcVar1 = (this->super_cmCPackIFWCommon).Generator;
      if (pcVar1 != (cmCPackIFWGenerator *)0x0) {
        pcVar2 = (pcVar1->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar2,8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                        ,0x150,local_1d8._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_1d8);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    }
    ConfigureFromPrefix(this,&prefix);
    std::__cxx11::string::~string((string *)&prefix);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int cmCPackIFWPackage::ConfigureFromGroup(cmCPackComponentGroup* group)
{
  if (!group) {
    return 0;
  }

  // Restore default configuration
  this->DefaultConfiguration();

  std::string prefix = "CPACK_IFW_COMPONENT_GROUP_" +
    cmsys::SystemTools::UpperCase(group->Name) + "_";

  this->DisplayName[""] = group->DisplayName;
  this->Description[""] = group->Description;

  // Version
  if (cmValue optVERSION = this->GetOption(prefix + "VERSION")) {
    this->Version = *optVERSION;
  } else if (cmValue optPACKAGE_VERSION =
               this->GetOption("CPACK_PACKAGE_VERSION")) {
    this->Version = *optPACKAGE_VERSION;
  } else {
    this->Version = "1.0.0";
  }

  // Script
  if (cmValue option = this->GetOption(prefix + "SCRIPT")) {
    this->Script = *option;
  }

  // User interfaces
  if (cmValue option = this->GetOption(prefix + "USER_INTERFACES")) {
    this->UserInterfaces.clear();
    cmExpandList(option, this->UserInterfaces);
  }

  // Licenses
  if (cmValue option = this->GetOption(prefix + "LICENSES")) {
    this->Licenses.clear();
    cmExpandList(option, this->Licenses);
    if (this->Licenses.size() % 2 != 0) {
      cmCPackIFWLogger(
        WARNING,
        prefix << "LICENSES"
               << " should contain pairs of <display_name> and <file_path>."
               << std::endl);
      this->Licenses.clear();
    }
  }

  // Priority
  if (cmValue option = this->GetOption(prefix + "PRIORITY")) {
    this->SortingPriority = *option;
    cmCPackIFWLogger(
      WARNING,
      "The \"PRIORITY\" option is set "
        << "for component group \"" << group->Name
        << "\", but there option is "
        << "deprecated. Please use \"SORTING_PRIORITY\" option instead."
        << std::endl);
  }

  return this->ConfigureFromPrefix(prefix);
}